

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

void __thiscall YAML::Emitter::SpaceOrIndentTo(Emitter *this,bool requireSpace,size_t indent)

{
  ostream_wrapper *stream;
  IndentTo local_28;
  
  stream = &this->m_stream;
  if ((this->m_stream).m_comment == true) {
    YAML::operator<<(stream,(char (*) [2])0x6ecc3e);
  }
  if (requireSpace && (this->m_stream).m_col != 0) {
    YAML::operator<<(stream,(char (*) [2])0x6e09f8);
  }
  local_28.n = indent;
  YAML::operator<<(stream,&local_28);
  return;
}

Assistant:

void Emitter::SpaceOrIndentTo(bool requireSpace, std::size_t indent) {
  if (m_stream.comment())
    m_stream << "\n";
  if (m_stream.col() > 0 && requireSpace)
    m_stream << " ";
  m_stream << IndentTo(indent);
}